

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void resetAccumulator(Parse *pParse,AggInfo *pAggInfo)

{
  Vdbe *p;
  ExprList *pList;
  int addr;
  KeyInfo *zP4;
  int *piVar1;
  int iVar2;
  
  if (pAggInfo->nFunc + pAggInfo->nColumn != 0) {
    p = pParse->pVdbe;
    sqlite3VdbeAddOp3(p,0x3b,0,pAggInfo->mnReg,pAggInfo->mxReg);
    if (0 < pAggInfo->nFunc) {
      piVar1 = &pAggInfo->aFunc->iDistinct;
      iVar2 = 0;
      do {
        if (-1 < *piVar1) {
          pList = (((AggInfo_func *)(piVar1 + -5))->pExpr->x).pList;
          if ((pList == (ExprList *)0x0) || (pList->nExpr != 1)) {
            sqlite3ErrorMsg(pParse,"DISTINCT aggregates must have exactly one argument");
            *piVar1 = -1;
          }
          else {
            zP4 = keyInfoFromExprList(pParse,pList,0,0);
            addr = sqlite3VdbeAddOp3(p,0x6c,*piVar1,0,0);
            sqlite3VdbeChangeP4(p,addr,(char *)zP4,-9);
          }
        }
        iVar2 = iVar2 + 1;
        piVar1 = piVar1 + 6;
      } while (iVar2 < pAggInfo->nFunc);
    }
  }
  return;
}

Assistant:

static void resetAccumulator(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pFunc;
  int nReg = pAggInfo->nFunc + pAggInfo->nColumn;
  if( nReg==0 ) return;
#ifdef SQLITE_DEBUG
  /* Verify that all AggInfo registers are within the range specified by
  ** AggInfo.mnReg..AggInfo.mxReg */
  assert( nReg==pAggInfo->mxReg-pAggInfo->mnReg+1 );
  for(i=0; i<pAggInfo->nColumn; i++){
    assert( pAggInfo->aCol[i].iMem>=pAggInfo->mnReg
         && pAggInfo->aCol[i].iMem<=pAggInfo->mxReg );
  }
  for(i=0; i<pAggInfo->nFunc; i++){
    assert( pAggInfo->aFunc[i].iMem>=pAggInfo->mnReg
         && pAggInfo->aFunc[i].iMem<=pAggInfo->mxReg );
  }
#endif
  sqlite3VdbeAddOp3(v, OP_Null, 0, pAggInfo->mnReg, pAggInfo->mxReg);
  for(pFunc=pAggInfo->aFunc, i=0; i<pAggInfo->nFunc; i++, pFunc++){
    if( pFunc->iDistinct>=0 ){
      Expr *pE = pFunc->pExpr;
      assert( !ExprHasProperty(pE, EP_xIsSelect) );
      if( pE->x.pList==0 || pE->x.pList->nExpr!=1 ){
        sqlite3ErrorMsg(pParse, "DISTINCT aggregates must have exactly one "
           "argument");
        pFunc->iDistinct = -1;
      }else{
        KeyInfo *pKeyInfo = keyInfoFromExprList(pParse, pE->x.pList, 0, 0);
        sqlite3VdbeAddOp4(v, OP_OpenEphemeral, pFunc->iDistinct, 0, 0,
                          (char*)pKeyInfo, P4_KEYINFO);
      }
    }
  }
}